

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioUtils.c
# Opt level: O1

void Mio_LibraryMatchesStop(Mio_Library_t *pLib)

{
  Vec_Wec_t *__ptr;
  void *__ptr_00;
  Vec_Mem_t *pVVar1;
  int *piVar2;
  long lVar3;
  long lVar4;
  
  if (pLib->vTtMem != (Vec_Mem_t *)0x0) {
    __ptr = pLib->vTt2Match;
    if (0 < __ptr->nCap) {
      lVar4 = 8;
      lVar3 = 0;
      do {
        __ptr_00 = *(void **)((long)&__ptr->pArray->nCap + lVar4);
        if (__ptr_00 != (void *)0x0) {
          free(__ptr_00);
          *(undefined8 *)((long)&__ptr->pArray->nCap + lVar4) = 0;
        }
        lVar3 = lVar3 + 1;
        lVar4 = lVar4 + 0x10;
      } while (lVar3 < __ptr->nCap);
    }
    if (__ptr->pArray != (Vec_Int_t *)0x0) {
      free(__ptr->pArray);
      __ptr->pArray = (Vec_Int_t *)0x0;
    }
    __ptr->nCap = 0;
    __ptr->nSize = 0;
    free(__ptr);
    pVVar1 = pLib->vTtMem;
    if (pVVar1 != (Vec_Mem_t *)0x0) {
      if (pVVar1->vTable != (Vec_Int_t *)0x0) {
        piVar2 = pVVar1->vTable->pArray;
        if (piVar2 != (int *)0x0) {
          free(piVar2);
          pVVar1->vTable->pArray = (int *)0x0;
        }
        if (pVVar1->vTable != (Vec_Int_t *)0x0) {
          free(pVVar1->vTable);
          pVVar1->vTable = (Vec_Int_t *)0x0;
        }
      }
      if (pVVar1->vNexts != (Vec_Int_t *)0x0) {
        piVar2 = pVVar1->vNexts->pArray;
        if (piVar2 != (int *)0x0) {
          free(piVar2);
          pVVar1->vNexts->pArray = (int *)0x0;
        }
        if (pVVar1->vNexts != (Vec_Int_t *)0x0) {
          free(pVVar1->vNexts);
          pVVar1->vNexts = (Vec_Int_t *)0x0;
        }
      }
    }
    pVVar1 = pLib->vTtMem;
    if (-1 < pVVar1->iPage) {
      lVar3 = -1;
      do {
        if (pVVar1->ppPages[lVar3 + 1] != (word *)0x0) {
          free(pVVar1->ppPages[lVar3 + 1]);
          pVVar1->ppPages[lVar3 + 1] = (word *)0x0;
        }
        lVar3 = lVar3 + 1;
      } while (lVar3 < pVVar1->iPage);
    }
    if (pVVar1->ppPages != (word **)0x0) {
      free(pVVar1->ppPages);
      pVVar1->ppPages = (word **)0x0;
    }
    if (pVVar1 != (Vec_Mem_t *)0x0) {
      free(pVVar1);
    }
    if (pLib->pCells != (Mio_Cell2_t *)0x0) {
      free(pLib->pCells);
      pLib->pCells = (Mio_Cell2_t *)0x0;
    }
  }
  return;
}

Assistant:

void Mio_LibraryMatchesStop( Mio_Library_t * pLib )
{
    if ( !pLib->vTtMem )
        return;
    Vec_WecFree( pLib->vTt2Match );
    Vec_MemHashFree( pLib->vTtMem );
    Vec_MemFree( pLib->vTtMem );
    ABC_FREE( pLib->pCells );
}